

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O2

bool __thiscall
cmFileTimeComparisonInternal::FileTimesDiffer(cmFileTimeComparisonInternal *this,char *f1,char *f2)

{
  bool bVar1;
  bool bVar2;
  stat s2;
  stat s1;
  stat sStack_138;
  stat local_a8;
  
  bVar1 = Stat(this,f1,&local_a8);
  bVar2 = true;
  if (bVar1) {
    bVar1 = Stat(this,f2,&sStack_138);
    if (bVar1) {
      bVar2 = TimesDiffer(this,&local_a8,&sStack_138);
    }
  }
  return bVar2;
}

Assistant:

bool cmFileTimeComparisonInternal::FileTimesDiffer(const char* f1,
                                                   const char* f2)
{
  // Get the modification time for each file.
  cmFileTimeComparison_Type s1;
  cmFileTimeComparison_Type s2;
  if (this->Stat(f1, &s1) && this->Stat(f2, &s2)) {
    // Compare the two modification times.
    return this->TimesDiffer(&s1, &s2);
  }
  // No comparison available.  Default to different times.
  return true;
}